

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::finalizeTest(QMakeParser *this,ushort **tokPtr)

{
  ProFile *pPVar1;
  QMakeParser *in_RSI;
  QMakeParser *in_RDI;
  
  flushScopes(in_RSI,(ushort **)in_RDI);
  putLineMarker(in_RDI,(ushort **)in_RSI);
  putOperator(in_RDI,(ushort **)in_RSI);
  if ((in_RDI->m_invert & 1U) != 0) {
    pPVar1 = in_RSI->m_proFile;
    in_RSI->m_proFile = (ProFile *)((long)&(pPVar1->m_refCount).m_cnt + 2);
    *(undefined2 *)&(pPVar1->m_refCount).m_cnt = 0x15;
  }
  in_RDI->m_invert = 0;
  in_RDI->m_state = StCond;
  in_RDI->m_canElse = true;
  return;
}

Assistant:

void QMakeParser::finalizeTest(ushort *&tokPtr)
{
    flushScopes(tokPtr);
    putLineMarker(tokPtr);
    putOperator(tokPtr);
    if (m_invert & 1)
        putTok(tokPtr, TokNot);
    m_invert = 0;
    m_state = StCond;
    m_canElse = true;
}